

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  float *pfVar3;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_max op;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  int local_1bc;
  float local_1b8;
  undefined1 local_1b1 [5];
  int local_1ac;
  float *local_1a8;
  undefined1 (*local_198) [32];
  undefined1 (*local_190) [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float *local_158;
  undefined1 (*local_150) [32];
  undefined8 local_140;
  undefined8 uStack_138;
  float *local_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  float *local_b8;
  undefined1 (*local_b0) [32];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1b8 = *in_RSI;
  local_1bc = 0;
  if (in_R8D == 4) {
    local_270 = *(undefined8 *)in_RSI;
    uStack_268 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_270 = CONCAT44(local_1b8,local_1b8);
    uStack_268 = CONCAT44(local_1b8,local_1b8);
    local_120 = local_1b8;
    fStack_11c = local_1b8;
    fStack_118 = local_1b8;
    fStack_114 = local_1b8;
    local_104 = local_1b8;
  }
  local_1d0 = local_270;
  uStack_1c8 = uStack_268;
  if (in_R8D == 8) {
    local_2a0 = *(undefined8 *)in_RSI;
    uStack_298 = *(undefined8 *)(in_RSI + 2);
    uStack_290 = *(undefined8 *)(in_RSI + 4);
    uStack_288 = *(undefined8 *)(in_RSI + 6);
  }
  else {
    local_100 = local_270;
    uStack_f8 = uStack_268;
    local_2a0 = local_270;
    uStack_298 = uStack_268;
    uStack_290 = local_270;
    uStack_288 = uStack_268;
  }
  local_200 = local_2a0;
  uStack_1f8 = uStack_298;
  uStack_1f0 = uStack_290;
  uStack_1e8 = uStack_288;
  local_1a8 = in_RDX;
  local_198 = in_RDI;
  for (; local_1bc + 7 < in_ECX; local_1bc = local_1bc + 8) {
    local_190 = local_198;
    local_220 = *(undefined8 *)*local_198;
    uStack_218 = *(undefined8 *)(*local_198 + 8);
    uStack_210 = *(undefined8 *)(*local_198 + 0x10);
    uStack_208 = *(undefined8 *)(*local_198 + 0x18);
    local_d8 = local_1b1;
    local_e0 = &local_220;
    local_e8 = &local_200;
    local_a0 = local_2a0;
    uStack_98 = uStack_298;
    uStack_90 = uStack_290;
    uStack_88 = uStack_288;
    auVar2._8_8_ = uStack_298;
    auVar2._0_8_ = local_2a0;
    auVar2._16_8_ = uStack_290;
    auVar2._24_8_ = uStack_288;
    local_240 = vmaxps_avx(*local_198,auVar2);
    local_158 = local_1a8;
    local_180 = local_240._0_8_;
    uStack_178 = local_240._8_8_;
    uStack_170 = local_240._16_8_;
    uStack_168 = local_240._24_8_;
    *(undefined8 *)local_1a8 = local_240._0_8_;
    *(undefined8 *)(local_1a8 + 2) = local_240._8_8_;
    *(undefined8 *)(local_1a8 + 4) = local_240._16_8_;
    *(undefined8 *)(local_1a8 + 6) = local_240._24_8_;
    local_198 = local_198 + 1;
    local_1a8 = local_1a8 + 8;
    local_80 = local_220;
    uStack_78 = uStack_218;
    uStack_70 = uStack_210;
    uStack_68 = uStack_208;
  }
  for (; local_1ac = in_ECX, local_1bc + 3 < in_ECX; local_1bc = local_1bc + 4) {
    local_150 = local_198;
    local_250 = *(undefined8 *)*local_198;
    uStack_248 = *(undefined8 *)(*local_198 + 8);
    local_c0 = local_1b1;
    local_c8 = &local_250;
    local_d0 = &local_1d0;
    local_50 = local_270;
    uStack_48 = uStack_268;
    auVar1._8_8_ = uStack_268;
    auVar1._0_8_ = local_270;
    auVar1 = vmaxps_avx(*(undefined1 (*) [16])*local_198,auVar1);
    local_128 = local_1a8;
    local_260 = auVar1._0_8_;
    local_140 = local_260;
    uStack_258 = auVar1._8_8_;
    uStack_138 = uStack_258;
    *(undefined8 *)local_1a8 = local_260;
    *(undefined8 *)(local_1a8 + 2) = uStack_258;
    local_198 = (undefined1 (*) [32])(*local_198 + 0x10);
    local_1a8 = local_1a8 + 4;
    local_40 = local_250;
    uStack_38 = uStack_248;
  }
  for (; local_1bc < local_1ac; local_1bc = local_1bc + 1) {
    local_a8 = local_1b1;
    local_b0 = local_198;
    local_b8 = &local_1b8;
    pfVar3 = std::max<float>((float *)local_198,local_b8);
    *local_1a8 = *pfVar3;
    local_198 = (undefined1 (*) [32])(*local_198 + 4);
    local_1a8 = local_1a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}